

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef
CompileLlvmVariableDefinitions(LlvmCompilationContext *ctx,ExprVariableDefinitions *node)

{
  ExprBase *expression;
  
  for (expression = (node->definitions).head; expression != (ExprBase *)0x0;
      expression = expression->next) {
    CompileLlvm(ctx,expression);
  }
  if ((node->super_ExprBase).type == ctx->ctx->typeVoid) {
    return (LLVMValueRef)0x0;
  }
  __assert_fail("node->type == ctx.ctx.typeVoid",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x27b,"LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)")
  ;
}

Assistant:

LLVMValueRef CompileLlvmVariableDefinitions(LlvmCompilationContext &ctx, ExprVariableDefinitions *node)
{
	for(ExprBase *value = node->definitions.head; value; value = value->next)
		CompileLlvm(ctx, value);

	return CheckType(ctx, node, NULL);
}